

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::_::HashSetCallbacks>::
find<kj::ArrayPtr<unsigned_char_const>,kj::ArrayPtr<unsigned_char_const>&>
          (HashIndex<kj::_::HashSetCallbacks> *this,
          ArrayPtr<kj::ArrayPtr<const_unsigned_char>_> table,ArrayPtr<const_unsigned_char> *params)

{
  char *pcVar1;
  uchar *puVar2;
  char *pcVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar8;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar9;
  ArrayPtr<const_unsigned_char> *pAVar10;
  uint uVar11;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *in_R8;
  uint *puVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  Maybe<unsigned_long> MVar17;
  
  aVar8.value = table.size_;
  pAVar10 = table.ptr;
  aVar9.value = aVar8.value;
  if (pAVar10[1].size_ != 0) {
    uVar4 = kj::_::HashCoder::operator*
                      ((HashCoder *)&kj::_::HASHCODER,*(ArrayPtr<const_unsigned_char> *)in_R8);
    uVar5 = kj::_::chooseBucket((uint)(uVar4 != 0),(uint)pAVar10[1].size_);
    puVar2 = pAVar10[1].ptr;
    uVar6 = (ulong)uVar5;
    uVar11 = *(uint *)(puVar2 + uVar6 * 8 + 4);
    aVar9 = extraout_RDX;
    if (uVar11 != 0) {
      puVar12 = (uint *)(puVar2 + uVar6 * 8);
      aVar9 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)in_R8->value;
      do {
        if ((uVar11 != 1) && (*puVar12 == (uint)(uVar4 != 0))) {
          lVar13 = (ulong)(uVar11 - 2) * 0x10;
          uVar7 = *(ulong *)((char *)(aVar8.value + 8) + lVar13);
          if (uVar7 == in_R8[1].value) {
            bVar16 = uVar7 == 0;
            if (!bVar16) {
              pcVar3 = *(char **)(lVar13 + aVar8.value);
              if (*pcVar3 != *(char *)aVar9) goto LAB_0021ff65;
              uVar15 = 0;
              do {
                uVar14 = uVar7;
                if (uVar7 - 1 == uVar15) break;
                lVar13 = uVar15 + 1;
                uVar14 = uVar15 + 1;
                pcVar1 = (char *)(aVar9.value + 1) + uVar15;
                uVar15 = uVar14;
              } while (pcVar3[lVar13] == *pcVar1);
              bVar16 = uVar7 <= uVar14;
            }
            if (bVar16) {
              *(undefined1 *)this = 1;
              this->erasedCount = (ulong)(uVar11 - 2);
              goto LAB_0021ff8b;
            }
          }
        }
LAB_0021ff65:
        uVar7 = uVar6 + 1;
        uVar6 = 0;
        if (uVar7 != pAVar10[1].size_) {
          uVar6 = uVar7 & 0xffffffff;
        }
        puVar12 = (uint *)(puVar2 + uVar6 * 8);
        uVar11 = puVar12[1];
      } while (uVar11 != 0);
    }
  }
  *(undefined1 *)this = 0;
LAB_0021ff8b:
  MVar17.ptr.field_1.value = aVar9.value;
  MVar17.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar17.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return nullptr;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return nullptr;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }